

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_port_server.cpp
# Opt level: O0

int main(void)

{
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  read_call_back local_68;
  connect_call_back local_48;
  undefined1 local_18 [8];
  CppNet net;
  
  cppnet::CppNet::CppNet((CppNet *)local_18);
  cppnet::CppNet::Init((CppNet *)local_18,1);
  std::function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)>::
  function<void(&)(std::shared_ptr<cppnet::CNSocket>,unsigned_int),void>
            ((function<void(std::shared_ptr<cppnet::CNSocket>,unsigned_int)> *)&local_48,ConnectFunc
            );
  cppnet::CppNet::SetAcceptCallback((CppNet *)local_18,&local_48);
  std::function<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>::~function(&local_48);
  std::
  function<void(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int)>::
  function<void(&)(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int),void>
            ((function<void(std::shared_ptr<cppnet::CNSocket>,std::shared_ptr<cppnet::Buffer>,unsigned_int)>
              *)&local_68,ReadFunc);
  cppnet::CppNet::SetReadCallback((CppNet *)local_18,&local_68);
  std::
  function<void_(std::shared_ptr<cppnet::CNSocket>,_std::shared_ptr<cppnet::Buffer>,_unsigned_int)>
  ::~function(&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"0.0.0.0",&local_89);
  cppnet::CppNet::ListenAndAccept((CppNet *)local_18,(string *)local_88,0x22d9);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"0.0.0.0",&local_b1);
  cppnet::CppNet::ListenAndAccept((CppNet *)local_18,(string *)local_b0,0x22da);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  cppnet::CppNet::Join((CppNet *)local_18);
  cppnet::CppNet::~CppNet((CppNet *)local_18);
  return 0;
}

Assistant:

int main() {

    cppnet::CppNet net;
    net.Init(1);

    net.SetAcceptCallback(ConnectFunc);
    net.SetReadCallback(ReadFunc);

    net.ListenAndAccept("0.0.0.0", 8921);
    net.ListenAndAccept("0.0.0.0", 8922);

    net.Join();
}